

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::SparseTextureClampLookupColorTestCase::iterate(SparseTextureClampLookupColorTestCase *this)

{
  ostringstream *this_00;
  int *piVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  ostream *poVar6;
  int iVar7;
  char *description;
  FunctionToken *pFVar8;
  qpTestResult testResult;
  TestContext *this_01;
  int iVar9;
  int *piVar10;
  GLuint texture;
  int *local_268;
  Functions *local_260;
  string *local_258;
  ostream *local_250;
  FunctionToken *local_248;
  allocator<char> local_240 [32];
  FunctionToken funcToken;
  undefined1 local_1b0 [384];
  
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_SparseTextureClampLookupResidencyTestCase).
                      super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                      super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->m_contextInfo
                     ,"GL_ARB_sparse_texture_clamp");
  if (bVar2) {
    iVar4 = (*((this->super_SparseTextureClampLookupResidencyTestCase).
               super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
               super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    local_260 = (Functions *)CONCAT44(extraout_var,iVar4);
    local_258 = (string *)
                &(this->super_SparseTextureClampLookupResidencyTestCase).
                 super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                 super_SparseTextureCommitmentTestCase.field_0x90;
    local_250 = (ostream *)
                &(this->super_SparseTextureClampLookupResidencyTestCase).
                 super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                 super_SparseTextureCommitmentTestCase.field_0x88;
    bVar2 = true;
    for (local_268 = (this->super_SparseTextureClampLookupResidencyTestCase).
                     super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                     super_SparseTextureCommitmentTestCase.mSupportedTargets.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
        local_268 !=
        (this->super_SparseTextureClampLookupResidencyTestCase).super_SparseTexture2LookupTestCase.
        super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.
        mSupportedTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish; local_268 = local_268 + 1) {
      for (piVar10 = (this->super_SparseTextureClampLookupResidencyTestCase).
                     super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                     super_SparseTextureCommitmentTestCase.mSupportedInternalFormats.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
          piVar10 !=
          (this->super_SparseTextureClampLookupResidencyTestCase).super_SparseTexture2LookupTestCase
          .super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.
          mSupportedInternalFormats.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish; piVar10 = piVar10 + 1) {
        cVar3 = (**(code **)(*(long *)&(this->super_SparseTextureClampLookupResidencyTestCase).
                                       super_SparseTexture2LookupTestCase.
                                       super_SparseTexture2CommitmentTestCase.
                                       super_SparseTextureCommitmentTestCase.super_TestCase.
                                       super_TestCase.super_TestNode + 0x30))
                          (this,*local_268,*piVar10);
        if (cVar3 != '\0') {
          pFVar8 = (this->super_SparseTextureClampLookupResidencyTestCase).
                   super_SparseTexture2LookupTestCase.mFunctions.
                   super__Vector_base<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          while( true ) {
            if (pFVar8 == (this->super_SparseTextureClampLookupResidencyTestCase).
                          super_SparseTexture2LookupTestCase.mFunctions.
                          super__Vector_base<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
                          ._M_impl.super__Vector_impl_data._M_finish) break;
            SparseTexture2LookupTestCase::FunctionToken::FunctionToken(&funcToken,pFVar8);
            cVar3 = (**(code **)(*(long *)&(this->super_SparseTextureClampLookupResidencyTestCase).
                                           super_SparseTexture2LookupTestCase.
                                           super_SparseTexture2CommitmentTestCase.
                                           super_SparseTextureCommitmentTestCase.super_TestCase.
                                           super_TestCase.super_TestNode + 0x88))
                              (this,*local_268,*piVar10,&funcToken);
            if (cVar3 != '\0') {
              local_248 = pFVar8;
              lVar5 = std::__cxx11::string::find((char *)&funcToken,0x170023e);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_1b0,glcts::fixed_sample_locations_values + 1,local_240);
              std::__cxx11::stringbuf::str(local_258);
              std::__cxx11::string::~string((string *)local_1b0);
              poVar6 = std::operator<<(local_250,
                                       "Testing sparse texture lookup color functions for target: ")
              ;
              piVar1 = local_268;
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,*local_268);
              poVar6 = std::operator<<(poVar6,", format: ");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,*piVar10);
              std::operator<<(poVar6," - ");
              (**(code **)(*(long *)&(this->super_SparseTextureClampLookupResidencyTestCase).
                                     super_SparseTexture2LookupTestCase.
                                     super_SparseTexture2CommitmentTestCase.
                                     super_SparseTextureCommitmentTestCase.super_TestCase.
                                     super_TestCase.super_TestNode + 0x40 + (ulong)(lVar5 == -1) * 8
                          ))(this,local_260,*piVar1,*piVar10,&texture,3);
              if (*piVar10 == 0x81a5) {
                (**(code **)(*(long *)&(this->super_SparseTextureClampLookupResidencyTestCase).
                                       super_SparseTexture2LookupTestCase.
                                       super_SparseTexture2CommitmentTestCase.
                                       super_SparseTextureCommitmentTestCase.super_TestCase.
                                       super_TestCase.super_TestNode + 0x90))
                          (this,local_260,*piVar1,&texture);
              }
              iVar4 = 0;
              for (iVar9 = 0;
                  iVar9 < (this->super_SparseTextureClampLookupResidencyTestCase).
                          super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                          super_SparseTextureCommitmentTestCase.mState.levels; iVar9 = iVar9 + 1) {
                iVar7 = *piVar10;
                if (lVar5 == -1) {
LAB_00add327:
                  (**(code **)(*(long *)&(this->super_SparseTextureClampLookupResidencyTestCase).
                                         super_SparseTexture2LookupTestCase.
                                         super_SparseTexture2CommitmentTestCase.
                                         super_SparseTextureCommitmentTestCase.super_TestCase.
                                         super_TestCase.super_TestNode + 0x50))
                            (this,local_260,*local_268,iVar7,&texture,iVar9);
                  iVar4 = iVar9;
                }
                else {
                  cVar3 = (**(code **)(*(long *)&(this->
                                                 super_SparseTextureClampLookupResidencyTestCase).
                                                 super_SparseTexture2LookupTestCase.
                                                 super_SparseTexture2CommitmentTestCase.
                                                 super_SparseTextureCommitmentTestCase.
                                                 super_TestCase.super_TestCase.super_TestNode + 0x60
                                      ))(this,local_260,*local_268,iVar7,&texture,iVar9);
                  if (cVar3 != '\0') {
                    iVar7 = *piVar10;
                    goto LAB_00add327;
                  }
                }
              }
              iVar9 = 0;
              do {
                if (iVar4 < iVar9) goto LAB_00add394;
                if (!bVar2) break;
                cVar3 = (**(code **)(*(long *)&(this->
                                               super_SparseTextureClampLookupResidencyTestCase).
                                               super_SparseTexture2LookupTestCase.
                                               super_SparseTexture2CommitmentTestCase.
                                               super_SparseTextureCommitmentTestCase.super_TestCase.
                                               super_TestCase.super_TestNode + 0x98))
                                  (this,local_260,*local_268,*piVar10,&texture,iVar9,&funcToken);
                iVar9 = iVar9 + 1;
                bVar2 = true;
              } while (cVar3 != '\0');
              bVar2 = false;
LAB_00add394:
              gl4cts::Texture::Delete(local_260,&texture);
              pFVar8 = local_248;
              if (!bVar2) {
                local_1b0._0_8_ =
                     ((this->super_SparseTextureClampLookupResidencyTestCase).
                      super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                      super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx)->m_log;
                this_00 = (ostringstream *)(local_1b0 + 8);
                std::__cxx11::ostringstream::ostringstream(this_00);
                std::__cxx11::stringbuf::str();
                std::operator<<((ostream *)this_00,(string *)local_240);
                std::operator<<((ostream *)this_00,"Fail");
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::string::~string((string *)local_240);
                std::__cxx11::ostringstream::~ostringstream(this_00);
                tcu::TestContext::setTestResult
                          ((this->super_SparseTextureClampLookupResidencyTestCase).
                           super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase
                           .super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.
                           super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
                SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&funcToken);
                return STOP;
              }
            }
            SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&funcToken);
            pFVar8 = pFVar8 + 1;
          }
        }
      }
    }
    this_01 = (this->super_SparseTextureClampLookupResidencyTestCase).
              super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
              super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    this_01 = (this->super_SparseTextureClampLookupResidencyTestCase).
              super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
              super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult SparseTextureClampLookupColorTestCase::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_texture_clamp"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool result = true;

	GLuint texture;

	for (std::vector<glw::GLint>::const_iterator iter = mSupportedTargets.begin(); iter != mSupportedTargets.end();
		 ++iter)
	{
		const GLint& target = *iter;

		for (std::vector<glw::GLint>::const_iterator formIter = mSupportedInternalFormats.begin();
			 formIter != mSupportedInternalFormats.end(); ++formIter)
		{
			const GLint& format = *formIter;

			if (!caseAllowed(target, format))
				continue;

			for (std::vector<FunctionToken>::const_iterator tokIter = mFunctions.begin(); tokIter != mFunctions.end();
				 ++tokIter)
			{
				// Check if target is allowed for current lookup function
				FunctionToken funcToken = *tokIter;
				if (!funcAllowed(target, format, funcToken))
					continue;

				bool isSparse = false;
				if (funcToken.name.find("sparse", 0) != std::string::npos)
					isSparse = true;

				mLog.str("");
				mLog << "Testing sparse texture lookup color functions for target: " << target << ", format: " << format
					 << " - ";

				if (isSparse)
					sparseAllocateTexture(gl, target, format, texture, 3);
				else
					allocateTexture(gl, target, format, texture, 3);

				if (format == GL_DEPTH_COMPONENT16)
					setupDepthMode(gl, target, texture);

				int l;
				int maxLevels = 0;
				for (l = 0; l < mState.levels; ++l)
				{
					if (!isSparse || commitTexturePage(gl, target, format, texture, l))
					{
						writeDataToTexture(gl, target, format, texture, l);
						maxLevels = l;
					}
				}

				for (l = 0; l <= maxLevels; ++l)
				{
					result = result && verifyLookupTextureData(gl, target, format, texture, l, funcToken);

					if (!result)
						break;
				}

				Texture::Delete(gl, texture);

				if (!result)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << mLog.str() << "Fail" << tcu::TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
					return STOP;
				}
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}